

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_1::LoadFileRaw(char *name,bool binary,string *buf)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  streambuf *psVar4;
  string local_3e8 [32];
  ostringstream local_3c8 [8];
  ostringstream oss;
  undefined8 local_250;
  pos_type size;
  char local_230 [8];
  ifstream ifs;
  string *buf_local;
  bool binary_local;
  char *name_local;
  
  bVar1 = DirExists(name);
  if (bVar1) {
    name_local._7_1_ = false;
  }
  else {
    std::ifstream::ifstream(local_230,name,((byte)~binary & 1) * 4 + _S_bin);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      name_local._7_1_ = false;
    }
    else {
      if (binary) {
        std::istream::seekg((long)local_230,_S_beg);
        _local_250 = std::istream::tellg();
        std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffdb0);
        std::__cxx11::string::resize((ulong)buf);
        std::istream::seekg((long)local_230,_S_beg);
        lVar3 = std::__cxx11::string::operator[]((ulong)buf);
        std::__cxx11::string::size();
        std::istream::read(local_230,lVar3);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_3c8);
        psVar4 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_3c8,psVar4);
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)buf,local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::ostringstream::~ostringstream(local_3c8);
      }
      bVar2 = std::ios::bad();
      name_local._7_1_ = (bool)((bVar2 ^ 0xff) & 1);
    }
    std::ifstream::~ifstream(local_230);
  }
  return name_local._7_1_;
}

Assistant:

static bool LoadFileRaw(const char *name, bool binary, std::string *buf) {
  if (DirExists(name)) return false;
  std::ifstream ifs(name, binary ? std::ifstream::binary : std::ifstream::in);
  if (!ifs.is_open()) return false;
  if (binary) {
    // The fastest way to read a file into a string.
    ifs.seekg(0, std::ios::end);
    auto size = ifs.tellg();
    (*buf).resize(static_cast<size_t>(size));
    ifs.seekg(0, std::ios::beg);
    ifs.read(&(*buf)[0], (*buf).size());
  } else {
    // This is slower, but works correctly on all platforms for text files.
    std::ostringstream oss;
    oss << ifs.rdbuf();
    *buf = oss.str();
  }
  return !ifs.bad();
}